

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cDirectStateAccessBuffersTests.cpp
# Opt level: O3

bool __thiscall
gl4cts::DirectStateAccess::Buffers::ErrorsTest::TestErrorsOfNamedBufferData(ErrorsTest *this)

{
  ostringstream *poVar1;
  char cVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  int iVar6;
  deUint32 dVar7;
  int iVar8;
  undefined4 extraout_var_00;
  undefined7 extraout_var;
  GLenum GVar10;
  _Elt_pointer puVar11;
  GLuint not_a_buffer_name;
  GLuint GVar12;
  GLenum *pGVar13;
  GLuint *pGVar14;
  ulong uVar15;
  ulong uVar16;
  GLuint immutable_buffer;
  GLubyte dummy_data [4];
  GLuint buffer;
  stack<unsigned_int,_std::deque<unsigned_int,_std::allocator<unsigned_int>_>_> too_much_buffers;
  GLuint tmp_buffer;
  GLuint local_228 [4];
  _Deque_base<unsigned_int,_std::allocator<unsigned_int>_> local_218;
  Enum<int,_2UL> local_1c0;
  undefined1 local_1b0 [120];
  ios_base local_138 [264];
  long lVar9;
  
  iVar6 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar9 = CONCAT44(extraout_var_00,iVar6);
  local_228[2] = 0;
  local_228[0] = 0;
  local_228[1] = 0;
  local_218._M_impl.super__Deque_impl_data._M_finish._M_last = (GLuint *)0x0;
  local_218._M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  local_218._M_impl.super__Deque_impl_data._M_finish._M_cur = (GLuint *)0x0;
  local_218._M_impl.super__Deque_impl_data._M_finish._M_first = (GLuint *)0x0;
  local_218._M_impl.super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
  local_218._M_impl.super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  local_218._M_impl.super__Deque_impl_data._M_start._M_cur = (GLuint *)0x0;
  local_218._M_impl.super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  local_218._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  local_218._M_impl.super__Deque_impl_data._M_map_size = 0;
  std::_Deque_base<unsigned_int,_std::allocator<unsigned_int>_>::_M_initialize_map(&local_218,0);
  (**(code **)(lVar9 + 0x3b8))(1,local_228 + 2);
  dVar7 = (**(code **)(lVar9 + 0x800))();
  glu::checkError(dVar7,"glCreateBuffers failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessBuffersTests.cpp"
                  ,0x1159);
  (**(code **)(lVar9 + 0x3b8))(1,local_228);
  dVar7 = (**(code **)(lVar9 + 0x800))();
  glu::checkError(dVar7,"glCreateBuffers failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessBuffersTests.cpp"
                  ,0x115c);
  (*this->m_pNamedBufferStorage)(local_228[0],4,local_228 + 1,1);
  dVar7 = (**(code **)(lVar9 + 0x800))();
  glu::checkError(dVar7,"glNamedBuffeStorage failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessBuffersTests.cpp"
                  ,0x115f);
  GVar12 = 0;
  do {
    GVar12 = GVar12 + 1;
    cVar2 = (**(code **)(lVar9 + 0xc68))(GVar12);
  } while (cVar2 != '\0');
  (*this->m_pNamedBufferData)(GVar12,4,local_228 + 1,0x88ea);
  bVar3 = ErrorCheckAndLog(this,"glNamedBufferData",0x502,
                           " if buffer is not the name of an existing buffer object.");
  uVar16 = CONCAT71(extraout_var,bVar3) & 0xffffffff;
  GVar10 = 0;
  do {
    GVar10 = GVar10 + 1;
    uVar15 = 3;
    pGVar13 = TestErrorsOfNamedBufferData::valid_usages + 2;
    do {
      if (pGVar13[-2] == GVar10) {
        pGVar13 = pGVar13 + -2;
        goto LAB_00a8cc3e;
      }
      if (pGVar13[-1] == GVar10) {
        pGVar13 = pGVar13 + -1;
        goto LAB_00a8cc3e;
      }
      if (*pGVar13 == GVar10) goto LAB_00a8cc3e;
      if (pGVar13[1] == GVar10) {
        pGVar13 = pGVar13 + 1;
        goto LAB_00a8cc3e;
      }
      uVar15 = uVar15 - 1;
      pGVar13 = pGVar13 + 4;
    } while (1 < uVar15);
    pGVar13 = TestErrorsOfNamedBufferData::valid_usages + 8;
    if (GVar10 != 0x88ea) break;
LAB_00a8cc3e:
  } while (pGVar13 != TestErrorsOfNamedBufferData::valid_usages + 9);
  (*this->m_pNamedBufferData)(local_228[2],4,local_228 + 1,GVar10);
  bVar3 = ErrorCheckAndLog(this,"glNamedBufferData",0x500,
                           " if usage is not STREAM_DRAW, STREAM_READ, STREAM_COPY, STATIC_DRAW, STATIC_READ, STATIC_COPY, DYNAMIC_DRAW, DYNAMIC_READ or DYNAMIC_COPY."
                          );
  (*this->m_pNamedBufferData)(local_228[2],-1,local_228 + 1,0x88ea);
  bVar4 = ErrorCheckAndLog(this,"glNamedBufferData",0x501," if size is negative.");
  (*this->m_pNamedBufferData)(local_228[0],2,local_228 + 1,0x88ea);
  bVar5 = ErrorCheckAndLog(this,"glNamedBufferData",0x502,
                           " if the BUFFER_IMMUTABLE_STORAGE flag of the buffer object is TRUE.");
  local_228[3] = (GLuint)CONCAT71((int7)(uVar16 >> 8),(byte)uVar16 & bVar3 & bVar4 & bVar5);
  iVar6 = 0x100;
  while( true ) {
    local_1b0._0_8_ = local_1b0._0_8_ & 0xffffffff00000000;
    (**(code **)(lVar9 + 0x3b8))(1,local_1b0);
    dVar7 = (**(code **)(lVar9 + 0x800))();
    glu::checkError(dVar7,"glCreateBuffers failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessBuffersTests.cpp"
                    ,0x11ad);
    if (local_218._M_impl.super__Deque_impl_data._M_finish._M_cur ==
        local_218._M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
      std::deque<unsigned_int,std::allocator<unsigned_int>>::_M_push_back_aux<unsigned_int_const&>
                ((deque<unsigned_int,std::allocator<unsigned_int>> *)&local_218,(uint *)local_1b0);
    }
    else {
      *local_218._M_impl.super__Deque_impl_data._M_finish._M_cur = local_1b0._0_4_;
      local_218._M_impl.super__Deque_impl_data._M_finish._M_cur =
           local_218._M_impl.super__Deque_impl_data._M_finish._M_cur + 1;
    }
    (*this->m_pNamedBufferData)(local_1b0._0_4_,0x7fffffffffffffff,(GLvoid *)0x0,0x88ea);
    iVar8 = (**(code **)(lVar9 + 0x800))();
    if (iVar8 != 0) break;
    iVar6 = iVar6 + -1;
    if (iVar6 == 0) {
      local_1b0._0_8_ = ((this->super_TestCase).m_context)->m_testCtx->m_log;
      poVar1 = (ostringstream *)(local_1b0 + 8);
      std::__cxx11::ostringstream::ostringstream(poVar1);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)poVar1,
                 "Test of NamedBufferData out of memory negative behavior failed to generate erroneous situation. Direct State Access Buffers Test\'s MAX_NUMBER_OF_TRIES_TO_GENERATE_OUT_OF_MEMORY_ERROR is too small or the driver implementation does not inform about out of memory problem."
                 ,0x10d);
      GVar12 = local_228[3];
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream(poVar1);
      std::ios_base::~ios_base(local_138);
LAB_00a8cec2:
      if (local_228[2] != 0) {
        (**(code **)(lVar9 + 0x438))(1,local_228 + 2);
        local_228[2] = 0;
      }
      if (local_218._M_impl.super__Deque_impl_data._M_finish._M_cur !=
          local_218._M_impl.super__Deque_impl_data._M_start._M_cur) {
        pGVar14 = local_218._M_impl.super__Deque_impl_data._M_finish._M_first;
        do {
          puVar11 = local_218._M_impl.super__Deque_impl_data._M_finish._M_cur;
          if (local_218._M_impl.super__Deque_impl_data._M_finish._M_cur == pGVar14) {
            puVar11 = local_218._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x80;
          }
          local_1b0._0_4_ = puVar11[-1];
          if (puVar11[-1] != 0) {
            (**(code **)(lVar9 + 0x438))(1,local_1b0);
            pGVar14 = local_218._M_impl.super__Deque_impl_data._M_finish._M_first;
          }
          if (local_218._M_impl.super__Deque_impl_data._M_finish._M_cur == pGVar14) {
            operator_delete(pGVar14,0x200);
            pGVar14 = local_218._M_impl.super__Deque_impl_data._M_finish._M_node[-1];
            local_218._M_impl.super__Deque_impl_data._M_finish._M_last = pGVar14 + 0x80;
            local_218._M_impl.super__Deque_impl_data._M_finish._M_cur = pGVar14 + 0x7f;
            local_218._M_impl.super__Deque_impl_data._M_finish._M_first = pGVar14;
            local_218._M_impl.super__Deque_impl_data._M_finish._M_node =
                 local_218._M_impl.super__Deque_impl_data._M_finish._M_node + -1;
          }
          else {
            local_218._M_impl.super__Deque_impl_data._M_finish._M_cur =
                 local_218._M_impl.super__Deque_impl_data._M_finish._M_cur + -1;
          }
        } while (local_218._M_impl.super__Deque_impl_data._M_finish._M_cur !=
                 local_218._M_impl.super__Deque_impl_data._M_start._M_cur);
      }
      if (local_228[0] != 0) {
        (**(code **)(lVar9 + 0x438))(1,local_228);
        local_228[0] = 0;
      }
      std::_Deque_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Deque_base(&local_218);
      return SUB41(GVar12,0);
    }
  }
  GVar12 = local_228[3];
  if (iVar8 != 0x505) {
    local_1b0._0_8_ = ((this->super_TestCase).m_context)->m_testCtx->m_log;
    poVar1 = (ostringstream *)(local_1b0 + 8);
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,
               "NamedBufferData does not generate OUT_OF_MEMORY error if the GL is unable to create a data store with the specified size."
               ,0x79);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"The error value of ",0x13)
    ;
    local_1c0.m_getName = glu::getErrorName;
    local_1c0.m_value = iVar8;
    tcu::Format::Enum<int,_2UL>::toStream(&local_1c0,(ostream *)poVar1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1," was observed.",0xe);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
    std::ios_base::~ios_base(local_138);
    GVar12 = 0;
  }
  goto LAB_00a8cec2;
}

Assistant:

bool ErrorsTest::TestErrorsOfNamedBufferData()
{
	/* Shortcut for GL functionality. */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Return value. */
	bool is_ok			= true;
	bool internal_error = false;

	/* Common variables. */
	glw::GLuint				buffer			 = 0;
	glw::GLuint				immutable_buffer = 0;
	glw::GLubyte			dummy_data[4]	= {};
	std::stack<glw::GLuint> too_much_buffers;

	try
	{
		/* Common preparations. */
		gl.createBuffers(1, &buffer);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glCreateBuffers failed.");

		gl.createBuffers(1, &immutable_buffer);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glCreateBuffers failed.");

		m_pNamedBufferStorage(immutable_buffer, sizeof(dummy_data), &dummy_data, GL_MAP_READ_BIT);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glNamedBuffeStorage failed.");

		/* Test invalid buffer name error behavior. */
		{
			/* Prepare for invalid buffer name error behavior verification. */
			glw::GLuint not_a_buffer_name = 0;

			while (gl.isBuffer(++not_a_buffer_name))
				;

			/* Test. */
			m_pNamedBufferData(not_a_buffer_name, sizeof(dummy_data), dummy_data, GL_DYNAMIC_COPY);

			is_ok &= ErrorCheckAndLog("glNamedBufferData", GL_INVALID_OPERATION,
									  " if buffer is not the name of an existing buffer object.");
		}

		/* Test invalid usage error behavior. */
		{
			/* Prepare for invalid type error behavior verification. */
			static const glw::GLenum valid_usages[] = { GL_STREAM_DRAW,  GL_STREAM_READ,  GL_STREAM_COPY,
														GL_STATIC_DRAW,  GL_STATIC_READ,  GL_STATIC_COPY,
														GL_DYNAMIC_DRAW, GL_DYNAMIC_READ, GL_DYNAMIC_COPY,
														GL_NONE };
			static const glw::GLenum valid_usages_last = sizeof(valid_usages) / sizeof(valid_usages[0]) - 1;

			glw::GLenum invalid_usage = 0;

			while (&valid_usages[valid_usages_last] !=
				   std::find(&valid_usages[0], &valid_usages[valid_usages_last], (++invalid_usage)))
				;

			/* Test. */
			m_pNamedBufferData(buffer, sizeof(dummy_data), dummy_data, invalid_usage);

			is_ok &=
				ErrorCheckAndLog("glNamedBufferData", GL_INVALID_ENUM,
								 " if usage is not STREAM_DRAW, STREAM_READ, STREAM_COPY, STATIC_DRAW, STATIC_READ,"
								 " STATIC_COPY, DYNAMIC_DRAW, DYNAMIC_READ or DYNAMIC_COPY.");
		}

		/* Test negative size error behavior. */
		{
			m_pNamedBufferData(buffer, -1, dummy_data, GL_DYNAMIC_COPY);

			is_ok &= ErrorCheckAndLog("glNamedBufferData", GL_INVALID_VALUE, " if size is negative.");
		}

		/* Test immutable buffer error behavior. */
		{
			m_pNamedBufferData(immutable_buffer, sizeof(dummy_data) / 2, dummy_data, GL_DYNAMIC_COPY);

			is_ok &= ErrorCheckAndLog("glNamedBufferData", GL_INVALID_OPERATION,
									  " if the BUFFER_IMMUTABLE_STORAGE flag of the buffer object is TRUE.");
		}

		/* Test out of memory error behavior. */
		{
			/* Calculate maximum buffer size (depending on number of bits of function argument). */
			glw::GLsizei max_pointer_unsigned_bits =
				(CHAR_BIT * sizeof(glw::GLsizeiptr) - 1) /* do not include possible sign bit */;
			glw::GLsizeiptr max_possible_size = 0;

			for (glw::GLsizei i = 0; i < max_pointer_unsigned_bits; ++i)
			{
				max_possible_size |= ((glw::GLsizeiptr)1 << i);
			}

			/* Error storing variable. */
			glw::GLenum error = GL_NO_ERROR;

			/* Try to overflow by allocating biggest possible buffers in a loop. */
			for (glw::GLuint i = 0; i < MAX_NUMBER_OF_TRIES_TO_GENERATE_OUT_OF_MEMORY_ERROR; ++i)
			{
				/* New big buffer creation. */
				glw::GLuint tmp_buffer = 0;

				gl.createBuffers(1, &tmp_buffer);
				GLU_EXPECT_NO_ERROR(gl.getError(), "glCreateBuffers failed.");

				/* Add it to delete list. */
				too_much_buffers.push(tmp_buffer);

				/* Try to allocate big buffer storage. */
				m_pNamedBufferData(tmp_buffer, max_possible_size, DE_NULL, GL_DYNAMIC_COPY);

				/* Check for errors. */
				error = gl.getError();

				if (error != GL_NO_ERROR)
				{
					break;
				}
			}

			if (error == GL_NO_ERROR)
			{
				/* Log. */
				m_context.getTestContext().getLog()
					<< tcu::TestLog::Message << "Test of NamedBufferData out of memory negative behavior failed to "
												"generate erroneous situation. "
												"Direct State Access Buffers Test's "
												"MAX_NUMBER_OF_TRIES_TO_GENERATE_OUT_OF_MEMORY_ERROR is too small or "
												"the driver implementation does not inform about out of memory problem."
					<< tcu::TestLog::EndMessage;
			}
			else
			{
				if (error != GL_OUT_OF_MEMORY)
				{
					/* Log. */
					m_context.getTestContext().getLog()
						<< tcu::TestLog::Message << "NamedBufferData does not generate OUT_OF_MEMORY error if the GL "
													"is unable to create a data store with the specified size."
						<< "The error value of " << glu::getErrorStr(error) << " was observed."
						<< tcu::TestLog::EndMessage;

					is_ok = false;
				}
			}
		}
	}
	catch (...)
	{
		is_ok		   = false;
		internal_error = true;
	}

	if (buffer)
	{
		gl.deleteBuffers(1, &buffer);

		buffer = 0;
	}

	while (!too_much_buffers.empty())
	{
		glw::GLuint tmp_buffer = too_much_buffers.top();

		if (tmp_buffer)
		{
			gl.deleteBuffers(1, &tmp_buffer);
		}

		too_much_buffers.pop();
	}

	if (immutable_buffer)
	{
		gl.deleteBuffers(1, &immutable_buffer);

		immutable_buffer = 0;
	}

	if (internal_error)
	{
		throw 0;
	}

	return is_ok;
}